

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak3.cpp
# Opt level: O2

int __thiscall Cipher::Processor::init(Processor *this,EVP_PKEY_CTX *ctx)

{
  TClusters *clusters;
  double dVar1;
  undefined8 extraout_RAX;
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  *in_RCX;
  TFreqMap *in_RDX;
  TSimilarityMap *this_00;
  Processor *pPVar2;
  TClusterToLetterMap *in_R9;
  TResult local_80;
  
  TParameters::operator=(&this->m_params,(TParameters *)ctx);
  this->m_freqMap = in_RDX;
  this_00 = &this->m_similarityMap;
  std::
  vector<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
  ::operator=(this_00,in_RCX);
  local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80.id = 0;
  local_80.p = -999.0;
  local_80.pClusters = -999.0;
  local_80.clMap._M_t._M_impl._0_8_ = 0;
  local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80.clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_80.clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_80.clusters.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80.clMap._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  TResult::operator=(&this->m_curResult,&local_80);
  TResult::~TResult(&local_80);
  normalizeSimilarityMap(&this->m_params,this_00,&this->m_logMap,&this->m_logMapInv);
  clusters = &(this->m_curResult).clusters;
  pPVar2 = this;
  generateClustersInitialGuess(&this->m_params,this_00,clusters);
  this->m_nInitialIters = 0;
  dVar1 = calcPClusters(&pPVar2->m_params,this_00,&this->m_logMap,&this->m_logMapInv,clusters,in_R9)
  ;
  this->m_pCur = dVar1;
  (this->m_curResult).pClusters = dVar1;
  this->m_pZero = dVar1;
  return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
}

Assistant:

bool Processor::init(
            const TParameters & params,
            const TFreqMap & freqMap,
            const TSimilarityMap & similarityMap) {
        m_params = params;
        m_freqMap = &freqMap;
        m_similarityMap = similarityMap;
        m_curResult = {};

        normalizeSimilarityMap(m_params, m_similarityMap, m_logMap, m_logMapInv);
        generateClustersInitialGuess(m_params, m_similarityMap, m_curResult.clusters);

        //Cipher::beamSearch(m_params, *m_freqMap, m_curResult);
        m_nInitialIters = 0;
        m_pCur = calcPClusters(m_params, m_similarityMap, m_logMap, m_logMapInv, m_curResult.clusters, m_curResult.clMap);
        m_curResult.pClusters = m_pCur;
        m_pZero = m_pCur;

        return true;
    }